

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::setShaderInputs
          (ShaderCompilerCase *this,deUint32 program,ProgramContext *progCtx)

{
  uint uVar1;
  pointer pAVar2;
  pointer pUVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  float *pfVar7;
  int uniformNdx;
  long lVar8;
  int attribNdx;
  long lVar9;
  long lVar5;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  lVar8 = 0x20;
  lVar9 = 0;
  while( true ) {
    pAVar2 = (progCtx->vertexAttributes).
             super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(progCtx->vertexAttributes).
                  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2;
    if ((int)(lVar6 / 0x60) <= lVar9) break;
    iVar4 = (**(code **)(lVar5 + 0x780))
                      (program,*(undefined8 *)((long)(&pAVar2->value + -1) + lVar8),lVar6 % 0x60);
    if (-1 < iVar4) {
      (**(code **)(lVar5 + 0x610))(iVar4);
      (**(code **)(lVar5 + 0x19f0))
                (iVar4,4,0x1406,0,0,
                 (long)(((progCtx->vertexAttributes).
                         super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                         ._M_impl.super__Vector_impl_data._M_start)->value).m_data + lVar8 + -0x20);
    }
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x60;
  }
  lVar8 = 0x24;
  lVar9 = 0;
  while( true ) {
    pUVar3 = (progCtx->uniforms).
             super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(progCtx->uniforms).
                  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3;
    if ((int)(lVar6 / 0x68) <= lVar9) break;
    iVar4 = (**(code **)(lVar5 + 0xb48))
                      (program,*(undefined8 *)((long)(pUVar3->value).m_data + lVar8 + -0x48),
                       lVar6 % 0x68);
    if (-1 < iVar4) {
      pUVar3 = (progCtx->uniforms).
               super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)((long)(pUVar3->value).m_data + lVar8 + -0x28);
      if (uVar1 < 7) {
        pfVar7 = (float *)((long)(pUVar3->value).m_data + lVar8 + -0x24);
        switch(uVar1) {
        case 0:
          (**(code **)(lVar5 + 0x14e8))(iVar4,1,pfVar7);
          break;
        case 1:
          (**(code **)(lVar5 + 0x1528))(iVar4,1,pfVar7);
          break;
        case 2:
          (**(code **)(lVar5 + 0x1568))(iVar4,1,pfVar7);
          break;
        case 3:
          (**(code **)(lVar5 + 0x15a8))(iVar4,1,pfVar7);
          break;
        case 4:
          (**(code **)(lVar5 + 0x1610))(iVar4,1,0);
          break;
        case 5:
          (**(code **)(lVar5 + 0x1640))(iVar4,1,0);
          break;
        case 6:
          (**(code **)(lVar5 + 0x14f0))
                    (iVar4,(int)(*pfVar7 + *(float *)(&DAT_017cff80 + (ulong)(*pfVar7 < 0.0) * 4)));
        }
      }
    }
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x68;
  }
  return;
}

Assistant:

void ShaderCompilerCase::setShaderInputs (deUint32 program, const ProgramContext& progCtx) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Setup attributes.

	for (int attribNdx = 0; attribNdx < (int)progCtx.vertexAttributes.size(); attribNdx++)
	{
		int location = gl.getAttribLocation(program, progCtx.vertexAttributes[attribNdx].name.c_str());
		if (location >= 0)
		{
			gl.enableVertexAttribArray(location);
			gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, 0, progCtx.vertexAttributes[attribNdx].value.getPtr());
		}
	}

	// Setup uniforms.

	for (int uniformNdx = 0; uniformNdx < (int)progCtx.uniforms.size(); uniformNdx++)
	{
		int location = gl.getUniformLocation(program, progCtx.uniforms[uniformNdx].name.c_str());
		if (location >= 0)
		{
			const float* floatPtr = progCtx.uniforms[uniformNdx].value.getPtr();

			switch (progCtx.uniforms[uniformNdx].type)
			{
				case UniformSpec::TYPE_FLOAT:			gl.uniform1fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC2:			gl.uniform2fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC3:			gl.uniform3fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC4:			gl.uniform4fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_MAT3:			gl.uniformMatrix3fv(location, 1, GL_FALSE, floatPtr);				break;
				case UniformSpec::TYPE_MAT4:			gl.uniformMatrix4fv(location, 1, GL_FALSE, floatPtr);				break;
				case UniformSpec::TYPE_TEXTURE_UNIT:	gl.uniform1i(location, (GLint)deRoundFloatToInt32(*floatPtr));		break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}
	}
}